

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O0

uint JsToUint32(JsValue *val)

{
  undefined1 local_30 [8];
  JsValue i;
  JsValue *val_local;
  
  i.u.reference.name = (char *)val;
  JsToInteger(val,(JsValue *)local_30);
  if (((*i.u._8_8_ != 3) || (NAN((double)i._0_8_))) ||
     (((double)i._0_8_ == 0.0 && (!NAN((double)i._0_8_))))) {
    val_local._4_4_ = 0;
  }
  else {
    i._0_8_ = fmod((double)i._0_8_,4294967296.0);
    if ((double)i._0_8_ < 0.0) {
      i._0_8_ = (double)i._0_8_ + 4294967296.0;
    }
    val_local._4_4_ = (uint)(long)(double)i._0_8_;
  }
  return val_local._4_4_;
}

Assistant:

unsigned int JsToUint32(struct JsValue *val){
	
	struct JsValue i;
	JsToInteger(val, &i);
	if (val->type != JS_NUMBER || isnan(i.u.number) || i.u.number == 0.0)
		return 0;
	else {
		i.u.number = fmod(i.u.number ,4294967296.0); /* 2^32 */
		if (i.u.number < 0)
			i.u.number += 4294967296;
		return (unsigned int)i.u.number;
	}

}